

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O3

uint64_t helper_iwmmxt_addcb_aarch64(uint64_t x)

{
  return (x & 0xff) + (x >> 0x38) +
         (ulong)((uint)(x >> 0x10) & 0xff) + (ulong)((uint)(x >> 8) & 0xff) +
         (x >> 0x28 & 0xff) + (x >> 0x20 & 0xff) + (x >> 0x18 & 0xff) + (x >> 0x30 & 0xff);
}

Assistant:

uint64_t HELPER(iwmmxt_addcb)(uint64_t x)
{
    return
        ((x >> 0) & 0xff) + ((x >> 8) & 0xff) +
        ((x >> 16) & 0xff) + ((x >> 24) & 0xff) +
        ((x >> 32) & 0xff) + ((x >> 40) & 0xff) +
        ((x >> 48) & 0xff) + ((x >> 56) & 0xff);
}